

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O3

int lws_wsi_mux_action_pending_writeable_reqs(lws *wsi)

{
  int iVar1;
  lws *plVar2;
  int _and;
  
  plVar2 = (wsi->mux).child_list;
  do {
    if (plVar2 == (lws *)0x0) {
      _and = 4;
      iVar1 = 0;
LAB_001181da:
      iVar1 = lws_change_pollfd(wsi,_and,iVar1);
      return -(uint)(iVar1 != 0);
    }
    if ((plVar2->mux).requested_POLLOUT != '\0') {
      _and = 0;
      iVar1 = 4;
      goto LAB_001181da;
    }
    plVar2 = (plVar2->mux).sibling_list;
  } while( true );
}

Assistant:

int
lws_wsi_mux_action_pending_writeable_reqs(struct lws *wsi)
{
	struct lws *w = wsi->mux.child_list;

	while (w) {
		if (w->mux.requested_POLLOUT) {
			if (lws_change_pollfd(wsi, 0, LWS_POLLOUT))
				return -1;
			return 0;
		}
		w = w->mux.sibling_list;
	}

	if (lws_change_pollfd(wsi, LWS_POLLOUT, 0))
		return -1;

	return 0;
}